

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P33x.cpp
# Opt level: O0

void * P33xThread(void *pParam)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  double local_830;
  interval local_828;
  double local_810;
  interval local_808;
  interval local_7f0;
  char local_7d8 [8];
  char szTemp [256];
  char szSaveFilePath [256];
  int local_5d0;
  int i;
  int errcount;
  int threadperiod;
  CHRONO chrono_period;
  double dStack_578;
  BOOL bConnected;
  double pressure;
  timeval tv;
  P33X p33x;
  void *pParam_local;
  
  dStack_578 = 0.0;
  chrono_period._68_4_ = 0;
  i = 100;
  local_5d0 = 0;
  p33x.WaterDensity = (double)pParam;
  memset(&tv.tv_usec,0,0x550);
  StartChrono((CHRONO *)&errcount);
  do {
    while( true ) {
      StopChronoQuick((CHRONO *)&errcount);
      StartChrono((CHRONO *)&errcount);
      mSleep((long)i);
      if (bPauseP33x == 0) break;
      if (chrono_period._68_4_ != 0) {
        printf("P33x Paused.\n");
        chrono_period._68_4_ = 0;
        DisconnectP33x((P33X *)&tv.tv_usec);
      }
      if (bExit != 0) goto LAB_001c128d;
      mSleep(100);
    }
    if (bRestartP33x != 0) {
      if (chrono_period._68_4_ != 0) {
        printf("Restarting a P33x.\n");
        chrono_period._68_4_ = 0;
        DisconnectP33x((P33X *)&tv.tv_usec);
      }
      bRestartP33x = 0;
    }
    if (chrono_period._68_4_ == 0) {
      iVar1 = ConnectP33x((P33X *)&tv.tv_usec,"P33x0.txt");
      if (iVar1 == 0) {
        chrono_period._68_4_ = 1;
        i = p33x.BaudRate;
        if (p33x.RS232Port._784_8_ != 0) {
          fclose((FILE *)p33x.RS232Port._784_8_);
          p33x.RS232Port.DevType = 0;
          p33x.RS232Port._788_4_ = 0;
        }
        if ((p33x.timeout != 0) && (p33x.RS232Port._784_8_ == 0)) {
          sVar2 = strlen((char *)&p33x.LastTemperature);
          if (sVar2 == 0) {
            sprintf(local_7d8,"p33x");
          }
          else {
            sprintf(local_7d8,"%.127s",&p33x.LastTemperature);
          }
          sVar2 = strlen(local_7d8);
          szSaveFilePath._252_4_ = (undefined4)sVar2;
          do {
            szSaveFilePath._252_4_ = szSaveFilePath._252_4_ + -1;
            if ((int)szSaveFilePath._252_4_ < 0) break;
          } while (local_7d8[(int)szSaveFilePath._252_4_] != '.');
          if ((0 < (int)szSaveFilePath._252_4_) &&
             (sVar2 = strlen(local_7d8), (int)szSaveFilePath._252_4_ < (int)sVar2)) {
            sVar2 = strlen(local_7d8);
            memset(local_7d8 + (int)szSaveFilePath._252_4_,0,
                   sVar2 - (long)(int)szSaveFilePath._252_4_);
          }
          EnterCriticalSection(&strtimeCS);
          pcVar3 = strtimeex_fns();
          sprintf(szTemp + 0xf8,"log/%.127s_%.64s.csv",local_7d8,pcVar3);
          LeaveCriticalSection(&strtimeCS);
          p33x.RS232Port._784_8_ = fopen(szTemp + 0xf8,"w");
          if ((FILE *)p33x.RS232Port._784_8_ == (FILE *)0x0) {
            printf("Unable to create P33x data file.\n");
            goto LAB_001c128d;
          }
          fprintf((FILE *)p33x.RS232Port._784_8_,"tv_sec;tv_usec;pressure;\n");
          fflush((FILE *)p33x.RS232Port._784_8_);
        }
      }
      else {
        chrono_period._68_4_ = 0;
        mSleep(1000);
      }
    }
    else {
      iVar1 = GetPressureP33x((P33X *)&tv.tv_usec,&stack0xfffffffffffffa88);
      if (iVar1 == 0) {
        iVar1 = gettimeofday((timeval *)&pressure,(__timezone_ptr_t)0x0);
        if (iVar1 != 0) {
          pressure = 0.0;
          tv.tv_sec = 0;
        }
        EnterCriticalSection(&StateVariablesCS);
        pressure_mes = dStack_578;
        local_810 = Pressure2Height(dStack_578,(double)p33x._1336_8_,p33x.PressureRef);
        interval::interval(&local_808,&local_810);
        local_830 = -z_pressure_acc;
        interval::interval(&local_828,&local_830,&z_pressure_acc);
        operator+(&local_7f0,&local_808,&local_828);
        interval::operator=((interval *)&z_pressure,&local_7f0);
        LeaveCriticalSection(&StateVariablesCS);
        if (p33x.timeout != 0) {
          fprintf((FILE *)p33x.RS232Port._784_8_,"%d;%d;%f;\n",dStack_578,
                  (ulong)pressure & 0xffffffff,tv.tv_sec & 0xffffffff);
          fflush((FILE *)p33x.RS232Port._784_8_);
        }
      }
      else {
        printf("Connection to a P33x lost.\n");
        chrono_period._68_4_ = 0;
        DisconnectP33x((P33X *)&tv.tv_usec);
      }
    }
    if (((chrono_period._68_4_ == 0) && (local_5d0 = local_5d0 + 1, 0 < ExitOnErrorCount)) &&
       (ExitOnErrorCount <= local_5d0)) {
      bExit = 1;
    }
    if (bExit != 0) {
LAB_001c128d:
      StopChronoQuick((CHRONO *)&errcount);
      if (p33x.RS232Port._784_8_ != 0) {
        fclose((FILE *)p33x.RS232Port._784_8_);
        p33x.RS232Port.DevType = 0;
        p33x.RS232Port._788_4_ = 0;
      }
      if (chrono_period._68_4_ != 0) {
        DisconnectP33x((P33X *)&tv.tv_usec);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE P33xThread(void* pParam)
{
	P33X p33x;
	struct timeval tv;
	double pressure = 0;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 100;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&p33x, 0, sizeof(P33X));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseP33x)
		{
			if (bConnected)
			{
				printf("P33x Paused.\n");
				bConnected = FALSE;
				DisconnectP33x(&p33x);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartP33x)
		{
			if (bConnected)
			{
				printf("Restarting a P33x.\n");
				bConnected = FALSE;
				DisconnectP33x(&p33x);
			}
			bRestartP33x = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectP33x(&p33x, "P33x0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = p33x.threadperiod;

				if (p33x.pfSaveFile != NULL)
				{
					fclose(p33x.pfSaveFile); 
					p33x.pfSaveFile = NULL;
				}
				if ((p33x.bSaveRawData)&&(p33x.pfSaveFile == NULL)) 
				{
					if (strlen(p33x.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", p33x.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "p33x");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.csv", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					p33x.pfSaveFile = fopen(szSaveFilePath, "w");
					if (p33x.pfSaveFile == NULL) 
					{
						printf("Unable to create P33x data file.\n");
						break;
					}
					fprintf(p33x.pfSaveFile, "tv_sec;tv_usec;pressure;\n"); 
					fflush(p33x.pfSaveFile);
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			if (GetPressureP33x(&p33x, &pressure) == EXIT_SUCCESS)
			{
				if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }

				EnterCriticalSection(&StateVariablesCS);
				pressure_mes = pressure;
				z_pressure = Pressure2Height(pressure, p33x.PressureRef, p33x.WaterDensity)+interval(-z_pressure_acc, z_pressure_acc);
				LeaveCriticalSection(&StateVariablesCS);

				if (p33x.bSaveRawData)
				{
					fprintf(p33x.pfSaveFile, "%d;%d;%f;\n", (int)tv.tv_sec, (int)tv.tv_usec, pressure);
					fflush(p33x.pfSaveFile);
				}
			}
			else
			{
				printf("Connection to a P33x lost.\n");
				bConnected = FALSE;
				DisconnectP33x(&p33x);
			}		
		}

		//printf("P33xThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	if (p33x.pfSaveFile != NULL)
	{
		fclose(p33x.pfSaveFile); 
		p33x.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectP33x(&p33x);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}